

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_utility.cpp
# Opt level: O2

CSVReader * __thiscall
csv::parse(CSVReader *__return_storage_ptr__,csv *this,string_view in,CSVFormat *format)

{
  allocator<char> local_211;
  string local_210 [32];
  CSVFormat local_1f0;
  stringstream stream;
  
  std::__cxx11::string::string<std::allocator<char>>(local_210,(char *)in._M_len,&local_211);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream,local_210,_S_out|_S_in);
  std::__cxx11::string::~string(local_210);
  CSVFormat::CSVFormat(&local_1f0,(CSVFormat *)in._M_str);
  CSVReader::
  CSVReader<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (__return_storage_ptr__,&stream,&local_1f0);
  CSVFormat::~CSVFormat(&local_1f0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVReader parse(csv::string_view in, CSVFormat format) {
        std::stringstream stream(in.data());
        return CSVReader(stream, format);
    }